

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O3

void __thiscall QUrlModel::setFileSystemModel(QUrlModel *this,QFileSystemModel *model)

{
  void *pvVar1;
  undefined4 *puVar2;
  unsigned_long __i0;
  long lVar3;
  long in_FS_OFFSET;
  code *local_90;
  ImplFn local_88;
  code *local_80;
  ImplFn local_78;
  code *local_70;
  ImplFn local_68;
  code *local_60;
  undefined8 local_58;
  Connection local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fileSystemModel != model) {
    if (this->fileSystemModel != (QFileSystemModel *)0x0) {
      lVar3 = 0;
      do {
        QObject::disconnect((Connection *)(&(this->modelConnections).field_0x0 + lVar3));
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x18);
    }
    this->fileSystemModel = model;
    if (model != (QFileSystemModel *)0x0) {
      local_70 = dataChanged;
      lVar3 = 0;
      local_68 = (ImplFn)0x0;
      local_60 = QAbstractItemModel::dataChanged;
      local_58 = 0;
      puVar2 = (undefined4 *)operator_new(0x20);
      *puVar2 = 1;
      *(code **)(puVar2 + 2) =
           QtPrivate::
           QCallableObject<void_(QUrlModel::*)(const_QModelIndex_&,_const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
           ::impl;
      *(code **)(puVar2 + 4) = dataChanged;
      *(undefined8 *)(puVar2 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_50,(void **)model,(QObject *)&local_60,(void **)this,
                 (QSlotObjectBase *)&local_70,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
      local_80 = layoutChanged;
      local_78 = (ImplFn)0x0;
      local_60 = QAbstractItemModel::layoutChanged;
      local_58 = 0;
      puVar2 = (undefined4 *)operator_new(0x20);
      *puVar2 = 1;
      *(code **)(puVar2 + 2) =
           QtPrivate::QCallableObject<void_(QUrlModel::*)(),_QtPrivate::List<>,_void>::impl;
      *(code **)(puVar2 + 4) = layoutChanged;
      *(undefined8 *)(puVar2 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_48,(void **)model,(QObject *)&local_60,(void **)this,
                 (QSlotObjectBase *)&local_80,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
      local_90 = layoutChanged;
      local_88 = (ImplFn)0x0;
      local_60 = QAbstractItemModel::rowsRemoved;
      local_58 = 0;
      puVar2 = (undefined4 *)operator_new(0x20);
      *puVar2 = 1;
      *(code **)(puVar2 + 2) =
           QtPrivate::QCallableObject<void_(QUrlModel::*)(),_QtPrivate::List<>,_void>::impl;
      *(code **)(puVar2 + 4) = layoutChanged;
      *(undefined8 *)(puVar2 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&uStack_40,(void **)model,(QObject *)&local_60,(void **)this,
                 (QSlotObjectBase *)&local_90,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
      do {
        pvVar1 = *(void **)(&(this->modelConnections).field_0x0 + lVar3 * 8);
        *(void **)(&(this->modelConnections).field_0x0 + lVar3 * 8) = (&local_50)[lVar3].d_ptr;
        (&local_50)[lVar3].d_ptr = pvVar1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      lVar3 = 0x10;
      do {
        QMetaObject::Connection::~Connection((Connection *)((long)&local_50.d_ptr + lVar3));
        lVar3 = lVar3 + -8;
      } while (lVar3 != -8);
    }
    QStandardItemModel::clear();
    local_50.d_ptr = (void *)0xffffffffffffffff;
    local_48 = 0;
    uStack_40 = 0;
    (**(code **)(*(long *)this + 0x100))(this,0,1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrlModel::setFileSystemModel(QFileSystemModel *model)
{
    if (model == fileSystemModel)
        return;
    if (fileSystemModel != nullptr) {
        for (const auto &conn : std::as_const(modelConnections))
            disconnect(conn);
    }
    fileSystemModel = model;
    if (fileSystemModel != nullptr) {
        modelConnections = {
            connect(model, &QFileSystemModel::dataChanged,
                    this, &QUrlModel::dataChanged),
            connect(model, &QFileSystemModel::layoutChanged,
                    this, &QUrlModel::layoutChanged),
            connect(model, &QFileSystemModel::rowsRemoved,
                    this, &QUrlModel::layoutChanged),
        };
    }
    clear();
    insertColumns(0, 1);
}